

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall testing::internal::ExpectationBase::IsOverSaturated(ExpectationBase *this)

{
  uint uVar1;
  element_type *peVar2;
  byte bVar3;
  int iVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  uVar1 = this->call_count_;
  peVar2 = (this->cardinality_).impl_.
           super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar4 = (*peVar2->_vptr_CardinalityInterface[5])(peVar2,(ulong)uVar1);
  if ((char)iVar4 == '\0') {
    bVar3 = 0;
  }
  else {
    peVar2 = (this->cardinality_).impl_.
             super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar4 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)uVar1);
    bVar3 = (byte)iVar4 ^ 1;
  }
  return (bool)bVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return cardinality().IsOverSaturatedByCallCount(call_count_);
  }